

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bison.cpp
# Opt level: O1

long yytnamerr(char *yyres,char *yystr)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (*yystr == '\"') {
    lVar4 = 0;
    pcVar6 = yystr;
    do {
      pcVar7 = pcVar6 + 1;
      bVar1 = pcVar6[1];
      if (bVar1 < 0x5c) {
        if (bVar1 == 0x22) {
          if (yyres == (char *)0x0) {
            return lVar4;
          }
          yyres[lVar4] = '\0';
          return lVar4;
        }
        if ((bVar1 == 0x27) || (bVar1 == 0x2c)) break;
      }
      else if (bVar1 == 0x5c) {
        if (pcVar6[2] != '\\') break;
        pcVar7 = pcVar6 + 2;
      }
      if (yyres != (char *)0x0) {
        yyres[lVar4] = *pcVar7;
      }
      lVar4 = lVar4 + 1;
      pcVar6 = pcVar7;
    } while( true );
  }
  if (yyres == (char *)0x0) {
    lVar4 = -1;
    do {
      lVar5 = lVar4 + 1;
      lVar3 = lVar4 + 1;
      lVar4 = lVar5;
    } while (yystr[lVar3] != '\0');
  }
  else {
    lVar5 = -1;
    do {
      cVar2 = yystr[lVar5 + 1];
      yyres[lVar5 + 1] = cVar2;
      lVar5 = lVar5 + 1;
    } while (cVar2 != '\0');
  }
  return lVar5;
}

Assistant:

static YYPTRDIFF_T
yytnamerr (char *yyres, const char *yystr)
{
  if (*yystr == '"')
    {
      YYPTRDIFF_T yyn = 0;
      char const *yyp = yystr;
      for (;;)
        switch (*++yyp)
          {
          case '\'':
          case ',':
            goto do_not_strip_quotes;

          case '\\':
            if (*++yyp != '\\')
              goto do_not_strip_quotes;
            else
              goto append;

          append:
          default:
            if (yyres)
              yyres[yyn] = *yyp;
            yyn++;
            break;

          case '"':
            if (yyres)
              yyres[yyn] = '\0';
            return yyn;
          }
    do_not_strip_quotes: ;
    }

  if (yyres)
    return yystpcpy (yyres, yystr) - yyres;
  else
    return yystrlen (yystr);
}